

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::IsRFC4843(CNetAddr *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  array<unsigned_char,_3UL> local_13;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV6) {
    local_13._M_elems[0] = ' ';
    local_13._M_elems[1] = '\x01';
    local_13._M_elems[2] = '\0';
    bVar1 = util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,3ul>
                      (&this->m_addr,&local_13);
    if (bVar1) {
      if (0x10 < (this->m_addr)._size) {
        this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      bVar1 = ((this->m_addr)._union.direct[3] & 0xf0U) == 0x10;
      goto LAB_00a969ea;
    }
  }
  bVar1 = false;
LAB_00a969ea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsRFC4843() const
{
    return IsIPv6() && HasPrefix(m_addr, std::array<uint8_t, 3>{0x20, 0x01, 0x00}) &&
           (m_addr[3] & 0xF0) == 0x10;
}